

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

char * dec_ctx_init(dec_ctx *ctx,membuf *inbuf,membuf *outbuf)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  ctx->bits_read = 0;
  ctx->inbuf = (uchar *)inbuf->buf;
  ctx->inend = inbuf->len;
  ctx->inpos = 0;
  ctx->outbuf = outbuf;
  uVar1 = get_byte(ctx);
  ctx->bitbuf = uVar1;
  ctx->t[0].table_bit[0] = '\x02';
  ctx->t[0].table_bit[1] = '\x04';
  ctx->t[0].table_bit[2] = '\x04';
  ctx->t[0].table_off[0] = '0';
  ctx->t[0].table_off[1] = ' ';
  ctx->t[0].table_off[2] = '\x10';
  iVar4 = 0;
  iVar2 = 0;
  for (uVar3 = 0; uVar3 != 0x34; uVar3 = uVar3 + 1) {
    iVar4 = iVar4 + (1 << ((byte)iVar2 & 0x1f));
    if ((uVar3 & 0xf) == 0) {
      iVar4 = 1;
    }
    ctx->t[0].table_lo[uVar3] = (uchar)iVar4;
    ctx->t[0].table_hi[uVar3] = (uchar)((uint)iVar4 >> 8);
    iVar2 = get_bits(ctx,4);
    ctx->t[0].table_bi[uVar3] = (uchar)iVar2;
  }
  table_dump(ctx->t);
  return table_dump::buf;
}

Assistant:

char *
dec_ctx_init(struct dec_ctx *ctx, struct membuf *inbuf, struct membuf *outbuf)
{
    char *encoding;
    ctx->bits_read = 0;

    ctx->inbuf = membuf_get(inbuf);
    ctx->inend = membuf_memlen(inbuf);
    ctx->inpos = 0;

    ctx->outbuf = outbuf;

    /* init bitbuf */
    ctx->bitbuf = get_byte(ctx);

    /* init tables */
    table_init(ctx, ctx->t);
    encoding = table_dump(ctx->t);
    return encoding;
}